

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::ThreadData::start(ThreadData *this,size_t i_thread_index,size_t i_target_put_count,
                   size_t i_target_consume_count,uint64_t i_affinity_mask)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  ostringstream thread_name;
  thread local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_class_32_4_c8eb9a63_for__M_head_impl local_1a0 [3];
  ios_base local_130 [264];
  
  local_1a0[0].this = (ThreadData *)this;
  local_1a0[0].i_target_put_count = i_target_put_count;
  local_1a0[0].i_target_consume_count = i_target_consume_count;
  local_1a0[0].i_affinity_mask = i_affinity_mask;
  std::thread::
  thread<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>>::ThreadData::start(unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_,,void>
            (local_1c0,local_1a0);
  if (*(long *)(this + 0x18) == 0) {
    *(id *)(this + 0x18) = local_1c0[0]._M_id._M_thread;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    pcVar2 = "producer_consumer";
    if (i_target_consume_count == 0) {
      pcVar2 = "producer";
    }
    pcVar4 = "consumer";
    if (i_target_put_count != 0) {
      pcVar4 = pcVar2;
    }
    lVar3 = 8;
    if (i_target_put_count != 0) {
      lVar3 = (ulong)(i_target_consume_count != 0) * 9 + 8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar4,lVar3);
    std::__cxx11::stringbuf::str();
    set_thread_name((thread *)(this + 0x18),(char *)local_1c0[0]._M_id._M_thread);
    if (local_1c0[0]._M_id._M_thread != (id)local_1b0) {
      operator_delete((void *)local_1c0[0]._M_id._M_thread);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    return;
  }
  std::terminate();
}

Assistant:

void start(
              size_t   i_thread_index,
              size_t   i_target_put_count,
              size_t   i_target_consume_count,
              uint64_t i_affinity_mask)
            {
                m_thread = std::thread([=] {
                    thread_procedure(i_target_put_count, i_target_consume_count, i_affinity_mask);
                });

                // give a name to the thread
                std::ostringstream thread_name;
                thread_name << i_thread_index << "_";
                if (i_target_put_count == 0)
                    thread_name << "consumer";
                else if (i_target_consume_count == 0)
                    thread_name << "producer";
                else
                    thread_name << "producer_consumer";
                set_thread_name(m_thread, thread_name.str().c_str());
            }